

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

uint __thiscall
ON_BinaryArchive::Dump3dmChunk(ON_BinaryArchive *this,ON_TextLog *dump,int recursion_depth)

{
  ON_TextLog *this_00;
  bool bVar1;
  uint uVar2;
  ON__UINT64 OVar3;
  size_t sVar4;
  uchar extraout_RDX [8];
  ON_UUID uuid_00;
  long local_138;
  ON__INT64 extra;
  ON__INT64 delta;
  ON__UINT64 offset1;
  ON__UINT64 sizeof_file;
  char *sClassName;
  ON_UUID local_e0;
  ON_ClassId *pClassId;
  ON_UUID uuid_1;
  int anon_typecode;
  ON__UINT64 userdata_header_offset;
  uint opennurbs_object_chunk_typecode;
  int mn;
  int mj;
  int layer_index;
  ON_UUID uuid;
  uint object_chunk_typecode;
  uint idef_chunk_typecode;
  uint hatch_chunk_typecode;
  uint history_chunk_typecode;
  uint mapping_chunk_typecode;
  uint light_chunk_typecode;
  uint dimstyle_chunk_typecode;
  uint font_chunk_typecode;
  uint group_chunk_typecode;
  uint material_chunk_typecode_1;
  uint material_chunk_typecode;
  uint bitmap_chunk_typecode;
  uint record_typecode;
  int minor_userdata_version;
  int major_userdata_version;
  bool rc;
  ON__INT64 big_value;
  ON__UINT64 OStack_40;
  uint typecode;
  ON__UINT64 offset0;
  char *pcStack_30;
  bool bShortChunk;
  char *typecode_name;
  ON_TextLog *pOStack_20;
  int recursion_depth_local;
  ON_TextLog *dump_local;
  ON_BinaryArchive *this_local;
  
  pcStack_30 = (char *)0x0;
  offset0._7_1_ = 0;
  typecode_name._4_4_ = recursion_depth;
  pOStack_20 = dump;
  dump_local = (ON_TextLog *)this;
  OStack_40 = CurrentPosition(this);
  big_value._4_4_ = 0;
  minor_userdata_version._3_1_ =
       BeginRead3dmBigChunk
                 (this,(uint *)((long)&big_value + 4),(ON__INT64 *)&major_userdata_version);
  if (!(bool)minor_userdata_version._3_1_) {
    Dump3dmChunk_ErrorReportHelper(OStack_40,"BeginRead3dmChunk() failed.",pOStack_20);
    return big_value._4_4_;
  }
  if (big_value._4_4_ == 0) {
    Dump3dmChunk_ErrorReportHelper
              (OStack_40,"BeginRead3dmChunk() returned typecode = 0.",pOStack_20);
    EndRead3dmChunk(this);
    return 0;
  }
  if (typecode_name._4_4_ == 0) {
    ON_TextLog::Print(pOStack_20,"\n");
  }
  pcStack_30 = TypecodeName(big_value._4_4_);
  offset0._7_1_ = (big_value._4_4_ & 0x80000000) != 0;
  bVar1 = DumpChunk_PrintHeaderInfo
                    (OStack_40,big_value._4_4_,_major_userdata_version,pcStack_30,pOStack_20);
  if (!bVar1) {
    EndRead3dmChunk(this);
    return 0;
  }
  record_typecode = 0xffffffff;
  bitmap_chunk_typecode = 0xffffffff;
  if (big_value._4_4_ == 0xa0000026) {
    ON_TextLog::PushIndent(pOStack_20);
    ON_TextLog::Print(pOStack_20,"Version of opennurbs that wrote this file: %lld\n",
                      _major_userdata_version);
    ON_TextLog::PopIndent(pOStack_20);
    if (((this->m_3dm_opennurbs_version == 0) && (0 < (long)_major_userdata_version)) &&
       (_major_userdata_version < 0xffffffff)) {
      ON_SetBinaryArchiveOpenNURBSVersion(this,(uint)_major_userdata_version);
    }
  }
  else if (big_value._4_4_ - 0x7ffe < 2) {
    ON_TextLog::PushIndent(pOStack_20);
    if ((long)_major_userdata_version < 4) {
      Dump3dmChunk_ErrorReportHelper(OStack_40,"TCODE_ENDOFFILE chunk withlength < 4.",pOStack_20);
    }
    else {
      offset1 = 0;
      ReadEOFSizeOfFile(this,&offset1);
      this_00 = pOStack_20;
      OVar3 = CurrentPosition(this);
      ON_TextLog::Print(this_00,"current position = %d  stored size = %llu\n",OVar3,offset1);
    }
    ON_TextLog::PopIndent(pOStack_20);
  }
  else if (big_value._4_4_ == 0x27ffa) {
    ON_TextLog::PushIndent(pOStack_20);
    userdata_header_offset._0_4_ = 0;
    while ((userdata_header_offset._0_4_ = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1),
           (uint)userdata_header_offset != 0 && ((uint)userdata_header_offset != 0x80027fff))) {
      if (((uint)userdata_header_offset != 0x27ffd) &&
         (((uint)userdata_header_offset != 0x2fffb && ((uint)userdata_header_offset != 0x2fffc)))) {
        Dump3dmChunk_ErrorReportHelper
                  (OStack_40,"Rogue chunk in OpenNURBS class record.",pOStack_20);
      }
    }
    ON_TextLog::PopIndent(pOStack_20);
  }
  else if (big_value._4_4_ == 0x27ffd) {
    bVar1 = Read3dmChunkVersion(this,(int *)&record_typecode,(int *)&bitmap_chunk_typecode);
    if (bVar1) {
      ON_TextLog::PushIndent(pOStack_20);
      ON_TextLog::Print(pOStack_20,"UserData chunk version: %d.%d\n",(ulong)record_typecode,
                        (ulong)bitmap_chunk_typecode);
      if ((record_typecode == 1) || (record_typecode == 2)) {
        register0x00000000 = CurrentPosition(this);
        if (record_typecode == 1 || record_typecode == 2) {
          bVar1 = Dump3dmChunk_UserDataHeaderHelper
                            (register0x00000000,this,record_typecode,bitmap_chunk_typecode,
                             pOStack_20);
          if ((bVar1) &&
             (uuid_1.Data4._0_4_ = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1),
             uuid_1.Data4._0_4_ != 0x40008000)) {
            Dump3dmChunk_ErrorReportHelper
                      (OStack_40,"Userdata Expected a TCODE_ANONYMOUS_CHUNK chunk.",pOStack_20);
          }
        }
        else if (2 < (int)record_typecode) {
          ON_TextLog::Print(pOStack_20,
                            "New user data format created after this diagnostic tool was written.\n"
                           );
        }
      }
      ON_TextLog::PopIndent(pOStack_20);
    }
    else {
      Dump3dmChunk_ErrorReportHelper
                (OStack_40,
                 "Read3dmChunkVersion() failed to read TCODE_OPENNURBS_CLASS_USERDATA chunk version."
                 ,pOStack_20);
    }
  }
  else if (big_value._4_4_ == 0x2fff9) {
    Dump3dmChunk_ErrorReportHelper
              (OStack_40,
               "Encountered TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk outside a TCODE_OPENNURBS_CLASS_USERDATA chunk."
               ,pOStack_20);
  }
  else {
    if (big_value._4_4_ != 0x2fffb) {
      if (big_value._4_4_ == 0x2008072) {
        ON_TextLog::PushIndent(pOStack_20);
        if ((long)_major_userdata_version < 0xe) {
          Dump3dmChunk_ErrorReportHelper
                    (OStack_40,"Length of chunk is too small.  Should be >= 14.",pOStack_20);
        }
        else {
          mj = 0;
          layer_index._0_2_ = 0;
          layer_index._2_2_ = 0;
          uuid._0_8_ = (uchar  [8])0x0;
          mn = -99;
          opennurbs_object_chunk_typecode = 0xffffffff;
          userdata_header_offset._4_4_ = 0xffffffff;
          bVar1 = Read3dmChunkVersion(this,(int *)&opennurbs_object_chunk_typecode,
                                      (int *)((long)&userdata_header_offset + 4));
          if (bVar1) {
            bVar1 = ReadUuid(this,(ON_UUID *)&mj);
            if (bVar1) {
              bVar1 = ReadInt(this,&mn);
              if (bVar1) {
                ON_TextLog::Print(pOStack_20,"Rhino object uuid: ");
                ON_TextLog::Print(pOStack_20,(ON_UUID *)&mj);
                ON_TextLog::Print(pOStack_20,"\n");
                ON_TextLog::Print(pOStack_20,"layer index: %d\n",(ulong)(uint)mn);
              }
              else {
                Dump3dmChunk_ErrorReportHelper
                          (OStack_40,"ReadInt() failed to read layer index.",pOStack_20);
              }
            }
            else {
              Dump3dmChunk_ErrorReportHelper(OStack_40,"ReadUuid() failed.",pOStack_20);
            }
          }
          else {
            Dump3dmChunk_ErrorReportHelper(OStack_40,"Read3dmChunkVersion() failed.",pOStack_20);
          }
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (((big_value._4_4_ + 0xeffffff0 < 10) || (big_value._4_4_ + 0xefffffe0 < 4)) ||
         (big_value._4_4_ + 0xefffffdb < 2)) {
        ON_TextLog::PushIndent(pOStack_20);
        do {
          uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
          if (uVar2 == 0) break;
        } while (uVar2 != 0xffffffff);
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008040) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008050) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008060) {
        ON_TextLog::PushIndent(pOStack_20);
        while ((uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1), uVar2 != 0 &&
               (uVar2 != 0x8200006f))) {
          if ((uVar2 != 0x27ffa) && ((uVar2 != 0x2000062 && (uVar2 != 0x2008061)))) {
            Dump3dmChunk_ErrorReportHelper(OStack_40,"Rogue chunk in light record.",pOStack_20);
          }
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008070) {
        ON_TextLog::PushIndent(pOStack_20);
        uuid.Data4[0] = '\0';
        uuid.Data4[1] = '\0';
        uuid.Data4[2] = '\0';
        uuid.Data4[3] = '\0';
        while ((uuid.Data4._0_4_ = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1),
               uuid.Data4._0_4_ != 0 && (uuid.Data4._0_4_ != 0x8200007f))) {
          if ((uuid.Data4._0_4_ != 0x82000071) &&
             (((uuid.Data4._0_4_ != 0x27ffa && (uuid.Data4._0_4_ != 0x2000073)) &&
              (uuid.Data4._0_4_ != 0x2008072)))) {
            Dump3dmChunk_ErrorReportHelper(OStack_40,"Rogue chunk in object record.",pOStack_20);
          }
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008073) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008074) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008075) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008076) {
        ON_TextLog::PushIndent(pOStack_20);
        uuid.Data4._4_4_ = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uuid.Data4._4_4_;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x20008077) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x2000807a) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ == 0x2000807b) {
        ON_TextLog::PushIndent(pOStack_20);
        uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
        if (big_value._4_4_ == 0) {
          big_value._4_4_ = uVar2;
        }
        ON_TextLog::PopIndent(pOStack_20);
        goto LAB_004b8e2b;
      }
      if (big_value._4_4_ != 0x20008080) {
        if (big_value._4_4_ == 0x20008090) {
          ON_TextLog::PushIndent(pOStack_20);
          uVar2 = Dump3dmChunk(this,pOStack_20,typecode_name._4_4_ + 1);
          if (big_value._4_4_ == 0) {
            big_value._4_4_ = uVar2;
          }
          ON_TextLog::PopIndent(pOStack_20);
        }
        goto LAB_004b8e2b;
      }
    }
    ON_TextLog::PushIndent(pOStack_20);
    stack0xffffffffffffff34 = (ON_ClassId *)0;
    uuid_1._0_8_ = (uchar  [8])0x0;
    local_e0.Data4 = (uchar  [8])0x0;
    bVar1 = ReadUuid(this,(ON_UUID *)((long)&pClassId + 4));
    if (bVar1) {
      if (big_value._4_4_ == 0x2fffb) {
        ON_TextLog::Print(pOStack_20,"OpenNURBS class id = ");
        sClassName = (char *)stack0xffffffffffffff34;
        local_e0.Data1 = uuid_1.Data1;
        local_e0.Data2 = uuid_1.Data2;
        local_e0.Data3 = uuid_1.Data3;
        uuid_00.Data4[0] = extraout_RDX[0];
        uuid_00.Data4[1] = extraout_RDX[1];
        uuid_00.Data4[2] = extraout_RDX[2];
        uuid_00.Data4[3] = extraout_RDX[3];
        uuid_00.Data4[4] = extraout_RDX[4];
        uuid_00.Data4[5] = extraout_RDX[5];
        uuid_00.Data4[6] = extraout_RDX[6];
        uuid_00.Data4[7] = extraout_RDX[7];
        uuid_00.Data1 = uuid_1.Data1;
        uuid_00.Data2 = uuid_1.Data2;
        uuid_00.Data3 = uuid_1.Data3;
        local_e0.Data4 = (uchar  [8])ON_ClassId::ClassId(stack0xffffffffffffff34,uuid_00);
      }
      else if (big_value._4_4_ == 0x20008080) {
        ON_TextLog::Print(pOStack_20,"User table id = ");
      }
      else {
        ON_TextLog::Print(pOStack_20,"UUID = ");
      }
      ON_TextLog::Print(pOStack_20,(ON_UUID *)((long)&pClassId + 4));
      if ((local_e0.Data4 != (uchar  [8])0x0) &&
         (sizeof_file = (ON__UINT64)ON_ClassId::ClassName((ON_ClassId *)local_e0.Data4),
         (char *)sizeof_file != (char *)0x0)) {
        ON_TextLog::Print(pOStack_20," (%s)",sizeof_file);
      }
      ON_TextLog::Print(pOStack_20,"\n");
    }
    else {
      Dump3dmChunk_ErrorReportHelper(OStack_40,"ReadUuid() failed.",pOStack_20);
    }
    ON_TextLog::PopIndent(pOStack_20);
  }
LAB_004b8e2b:
  OVar3 = CurrentPosition(this);
  bVar1 = EndRead3dmChunk(this,true);
  if (bVar1) {
    if ((offset0._7_1_ & 1) == 0) {
      if (OStack_40 < OVar3) {
        local_138 = OVar3 - OStack_40;
      }
      else {
        local_138 = -(OStack_40 - OVar3);
      }
      sVar4 = SizeofChunkLength(this);
      if ((long)(_major_userdata_version - ((local_138 + -4) - sVar4)) < 0) {
        Dump3dmChunk_ErrorReportHelper(OStack_40,"Read beyond end of chunk.",pOStack_20);
      }
    }
  }
  else {
    Dump3dmChunk_ErrorReportHelper(OVar3,"EndRead3dmChunk() failed.",pOStack_20);
  }
  return big_value._4_4_;
}

Assistant:

unsigned int 
ON_BinaryArchive::Dump3dmChunk( ON_TextLog& dump, int recursion_depth )
{
  //ON_BinaryArchive& file = *this;
  const char* typecode_name = 0;
  bool bShortChunk = false;
  const ON__UINT64 offset0 = CurrentPosition();
  unsigned int typecode = 0;
  ON__INT64 big_value;
  bool rc = BeginRead3dmBigChunk( &typecode, &big_value );
  if (!rc) 
  {
    Dump3dmChunk_ErrorReportHelper(offset0,"BeginRead3dmChunk() failed.",dump);
  }
  else 
  {
    if ( 0 == typecode ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset0,"BeginRead3dmChunk() returned typecode = 0.",dump);
      EndRead3dmChunk();
      return 0;
    }
    else {
      if ( 0 == recursion_depth )
      {
        dump.Print("\n");
      }

      ////bShortChunk = (0 != (typecode & TCODE_SHORT));
      typecode_name = ON_BinaryArchive::TypecodeName(typecode);
      bShortChunk = (0 != (typecode & TCODE_SHORT));
      if ( !DumpChunk_PrintHeaderInfo(offset0,typecode,big_value,typecode_name,dump) )
      {
        EndRead3dmChunk();
        return 0;
      }

      int major_userdata_version = -1;
      int minor_userdata_version = -1;

      switch( typecode ) 
      {
      case TCODE_PROPERTIES_TABLE:
      case TCODE_SETTINGS_TABLE:
      case TCODE_BITMAP_TABLE:
      case TCODE_MATERIAL_TABLE:
      case TCODE_LAYER_TABLE:
      case TCODE_GROUP_TABLE:
      case TCODE_LIGHT_TABLE:
      case TCODE_FONT_TABLE:
      case TCODE_DIMSTYLE_TABLE:
      case TCODE_HATCHPATTERN_TABLE:
      case TCODE_LINETYPE_TABLE:
      case TCODE_TEXTURE_MAPPING_TABLE:
      case TCODE_HISTORYRECORD_TABLE:
      case TCODE_USER_TABLE:
      case TCODE_INSTANCE_DEFINITION_TABLE:
      case TCODE_OBJECT_TABLE:
        // start of a table
        {
          dump.PushIndent();
          unsigned int record_typecode = 0;
          for (;;) {
            record_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !record_typecode ) {
              break;
            }
            if ( TCODE_ENDOFTABLE == record_typecode ) {
              break;
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_PROPERTIES_OPENNURBS_VERSION:
        {
          dump.PushIndent();
          dump.Print("Version of opennurbs that wrote this file: %lld\n",big_value);
          dump.PopIndent();           
          if (0 == m_3dm_opennurbs_version && big_value > 0 && ((ON__UINT64)big_value) < ON_UNSET_UINT_INDEX)
            ON_SetBinaryArchiveOpenNURBSVersion(*this,(ON__UINT32)big_value);
        }
        break;

      case TCODE_BITMAP_RECORD:
        {
          dump.PushIndent();
          unsigned int bitmap_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = bitmap_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_MATERIAL_RECORD:
        {
          dump.PushIndent();
          unsigned int material_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = material_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_LAYER_RECORD:
        {
          dump.PushIndent();
          unsigned int material_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = material_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_GROUP_RECORD:
        {
          dump.PushIndent();
          unsigned int group_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = group_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_FONT_RECORD:
        {
          dump.PushIndent();
          unsigned int font_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = font_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_DIMSTYLE_RECORD:
        {
          dump.PushIndent();
          unsigned int dimstyle_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = dimstyle_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_LIGHT_RECORD:
        {
          dump.PushIndent();
          unsigned int light_chunk_typecode = 0;
          for (;;) {
            light_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !light_chunk_typecode ) {
              break;
            }
            if ( TCODE_LIGHT_RECORD_END == light_chunk_typecode ) {
              break;
            }
            switch( light_chunk_typecode ) {
            //case TCODE_OBJECT_RECORD_TYPE:
            case TCODE_LIGHT_RECORD_ATTRIBUTES:
            case TCODE_LIGHT_RECORD_ATTRIBUTES_USERDATA:
            case TCODE_OPENNURBS_CLASS:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in light record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_TEXTURE_MAPPING_RECORD:
        {
          dump.PushIndent();
          unsigned int mapping_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = mapping_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_HISTORYRECORD_RECORD:
        {
          dump.PushIndent();
          unsigned int history_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = history_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_HATCHPATTERN_RECORD:
        {
          dump.PushIndent();
          unsigned int hatch_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = hatch_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_INSTANCE_DEFINITION_RECORD:
        {
          dump.PushIndent();
          unsigned int idef_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = idef_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_OBJECT_RECORD:
        {
          dump.PushIndent();
          unsigned int object_chunk_typecode = 0;
          for (;;) {
            object_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !object_chunk_typecode ) {
              break;
            }
            if ( TCODE_OBJECT_RECORD_END == object_chunk_typecode ) {
              break;
            }
            switch( object_chunk_typecode ) {
            case TCODE_OBJECT_RECORD_TYPE:
            case TCODE_OBJECT_RECORD_ATTRIBUTES:
            case TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA:
            case TCODE_OPENNURBS_CLASS:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in object record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OBJECT_RECORD_ATTRIBUTES:
        {
          dump.PushIndent();
          if ( big_value < 14 )
          {
            Dump3dmChunk_ErrorReportHelper(offset0,"Length of chunk is too small.  Should be >= 14.",dump);
          }
          else
          {
            ON_UUID uuid = ON_nil_uuid;
            int layer_index = -99;
            int mj = -1;
            int mn = -1;
            if ( !Read3dmChunkVersion(&mj,&mn))
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"Read3dmChunkVersion() failed.",dump);
            }
            else if (!ReadUuid(uuid))
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"ReadUuid() failed.",dump);
            }
            else if ( !ReadInt(&layer_index) )
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"ReadInt() failed to read layer index.",dump);
            }
            else
            {
              dump.Print("Rhino object uuid: ");
              dump.Print(uuid);
              dump.Print("\n");
              dump.Print("layer index: %d\n",layer_index);
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS:
        {
          dump.PushIndent();
          unsigned int opennurbs_object_chunk_typecode = 0;
          for (;;) {
            opennurbs_object_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1  );
            if ( !opennurbs_object_chunk_typecode ) {
              break;
            }
            if ( TCODE_OPENNURBS_CLASS_END == opennurbs_object_chunk_typecode ) {
              break;
            }
            switch( opennurbs_object_chunk_typecode ) 
            {
            case TCODE_OPENNURBS_CLASS_UUID:
              break;
            case TCODE_OPENNURBS_CLASS_DATA:
              break;
            case TCODE_OPENNURBS_CLASS_USERDATA:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in OpenNURBS class record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS_USERDATA:
        {
          if ( !Read3dmChunkVersion(&major_userdata_version, &minor_userdata_version ) )
          {
            Dump3dmChunk_ErrorReportHelper(offset0,"Read3dmChunkVersion() failed to read TCODE_OPENNURBS_CLASS_USERDATA chunk version.",dump);
          }
          else
          {
            dump.PushIndent();
            dump.Print("UserData chunk version: %d.%d\n",
                       major_userdata_version,
                       minor_userdata_version
                       );
            if ( 1 == major_userdata_version || 2 == major_userdata_version )
            {
              const ON__UINT64 userdata_header_offset = CurrentPosition();
              switch ( major_userdata_version )
              {
              case 1:
              case 2:
                {
                  // version 1 user data header information was not wrapped
                  // in a chunk.
                  //
                  // version 2 user data header information is wrapped
                  // in a TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk.
                  if ( Dump3dmChunk_UserDataHeaderHelper( 
                                  userdata_header_offset, *this, 
                                  major_userdata_version, minor_userdata_version,
                                  dump ) 
                     )
                  {
                    // a TCODE_ANONYMOUS_CHUNK contains user data goo
                    int anon_typecode =  Dump3dmChunk( dump, recursion_depth+1 );
                    if ( TCODE_ANONYMOUS_CHUNK != anon_typecode )
                    {
                      Dump3dmChunk_ErrorReportHelper( offset0,"Userdata Expected a TCODE_ANONYMOUS_CHUNK chunk.",dump);
                    }
                  }
                }
                break;
              default:
                if ( major_userdata_version < 3 )
                {
                }
                else
                {
                  dump.Print("New user data format created after this diagnostic tool was written.\n");
                }
                break;
              }
            }

            dump.PopIndent();
          }
        }
        break;

      case TCODE_OPENNURBS_CLASS_UUID:
      case TCODE_USER_TABLE_UUID:
        {
          dump.PushIndent();
          ON_UUID uuid = ON_nil_uuid;
          const ON_ClassId* pClassId = 0;
          if ( !ReadUuid( uuid ) ) {
             Dump3dmChunk_ErrorReportHelper(offset0,"ReadUuid() failed.",dump);
          }
          else 
          {
            if ( typecode == TCODE_OPENNURBS_CLASS_UUID ) 
            {
              dump.Print("OpenNURBS class id = ");
              pClassId = ON_ClassId::ClassId(uuid);
            }
            else if ( typecode == TCODE_USER_TABLE_UUID ) 
            {
              dump.Print("User table id = ");
            }
            else {
              dump.Print("UUID = ");
            }
            dump.Print( uuid );
            if ( pClassId )
            {
              const char* sClassName = pClassId->ClassName();
              if ( sClassName )
              {
                dump.Print(" (%s)",sClassName);
              }
            }
            dump.Print("\n");
          }

          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS_USERDATA_HEADER:
        {
          // we should never get here because this chunk is parsed in the TCODE_OPENNURBS_CLASS_USERDATA case above.
          Dump3dmChunk_ErrorReportHelper(offset0,"Encountered TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk outside a TCODE_OPENNURBS_CLASS_USERDATA chunk.",dump);
        }
        break;

      case TCODE_ENDOFFILE:
      case TCODE_ENDOFFILE_GOO:
        {
          dump.PushIndent();
          if ( big_value < 4 ) {
            Dump3dmChunk_ErrorReportHelper(offset0,"TCODE_ENDOFFILE chunk withlength < 4.",dump);
          }
          else {
            ON__UINT64 sizeof_file = 0;
            ReadEOFSizeOfFile(&sizeof_file);
            dump.Print("current position = %d  stored size = %llu\n",
                       CurrentPosition(), 
                       sizeof_file
                       );
          }
          dump.PopIndent();
        }
        break;

      }
    }

    const ON__UINT64 offset1 = CurrentPosition();
    if ( !EndRead3dmChunk(true) ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset1,"EndRead3dmChunk() failed.",dump);
      rc = false;
    }
    else if (!bShortChunk) 
    {
      ON__INT64 delta =  (offset1 > offset0)
                ?  ((ON__INT64)(offset1 - offset0))
                : -((ON__INT64)(offset0 - offset1));
      const ON__INT64 extra = big_value - (delta-4-SizeofChunkLength());
      if ( extra < 0 ) 
      {
        Dump3dmChunk_ErrorReportHelper(offset0,"Read beyond end of chunk.",dump);
      }
    }
  }
  return typecode;
}